

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVkImpl.hpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Diligent::ShaderVkImpl::GetSPIRV(ShaderVkImpl *this)

{
  int iVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  
  if (GetSPIRV()::NullSPIRV == '\0') {
    iVar1 = __cxa_guard_acquire(&GetSPIRV()::NullSPIRV);
    if (iVar1 != 0) {
      GetSPIRV::NullSPIRV.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      GetSPIRV::NullSPIRV.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      GetSPIRV::NullSPIRV.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __cxa_atexit(std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector,
                   &GetSPIRV::NullSPIRV,&__dso_handle);
      __cxa_guard_release(&GetSPIRV()::NullSPIRV);
    }
  }
  pvVar2 = &GetSPIRV::NullSPIRV;
  if (SHADER_STATUS_COMPILING < (this->super_ShaderBase<Diligent::EngineVkImplTraits>).m_Status._M_i
     ) {
    pvVar2 = &this->m_SPIRV;
  }
  return pvVar2;
}

Assistant:

GetSPIRV() const override final
    {
        static const std::vector<uint32_t> NullSPIRV;
        // NOTE: while shader is compiled asynchronously, m_SPIRV may be modified by
        //       another thread and thus can't be accessed.
        return !IsCompiling() ? m_SPIRV : NullSPIRV;
    }